

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.h
# Opt level: O3

Matrix<double,__1,__1> __thiscall
Matrix<double,_-1,_-1>::inverse(Matrix<double,__1,__1> *this,int *flag)

{
  bool bVar1;
  Matrix<double,__1,__1> MVar2;
  int iVar3;
  double *pdVar4;
  long lVar5;
  int iVar6;
  int j;
  int iVar7;
  int iVar8;
  int iVar9;
  long *plVar10;
  double dVar11;
  Matrix<double,__1,__1> copy;
  Matrix<double,__1,__1> Identity_;
  int local_7c;
  Matrix<double,__1,__1> local_78;
  double local_68;
  undefined8 uStack_60;
  double local_58;
  int *local_50;
  int local_44;
  Matrix<double,__1,__1> local_40;
  
  local_40.data = (double *)0x0;
  local_40.rows = -1;
  local_40.cols = -1;
  local_78.data = (double *)0x0;
  local_78.rows = -1;
  local_78.cols = -1;
  operator=(&local_78,*this);
  resize(&local_40,local_78.rows,local_78.cols);
  Identity(&local_40);
  if (this->cols == this->rows) {
    iVar7 = local_78.rows + -1;
    iVar8 = local_78.rows;
    local_50 = flag;
    if (0 < iVar7) {
      iVar6 = 0;
      do {
        pdVar4 = operator()(&local_78,iVar6,iVar6);
        dVar11 = ABS(*pdVar4);
        iVar3 = iVar6 + 1;
        iVar7 = iVar3;
        iVar9 = iVar6;
        if (iVar3 < local_78.rows) {
          do {
            uStack_60 = 0;
            local_68 = dVar11;
            pdVar4 = operator()(&local_78,iVar7,iVar6);
            dVar11 = local_68;
            if (local_68 < ABS(*pdVar4)) {
              dVar11 = ABS(*pdVar4);
              iVar9 = iVar7;
            }
            iVar7 = iVar7 + 1;
          } while (iVar7 < local_78.rows);
        }
        if (ABS(dVar11) <= 1e-10) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"this matrix is not invertible",0x1d);
          std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x10);
          std::ostream::put(-0x10);
          plVar10 = (long *)std::ostream::flush();
          lVar5 = *plVar10;
          goto LAB_0010fb79;
        }
        iVar8 = local_78.rows;
        if ((iVar9 != iVar6) && (0 < local_78.cols)) {
          iVar7 = 0;
          do {
            pdVar4 = operator()(&local_78,iVar6,iVar7);
            local_68 = *pdVar4;
            pdVar4 = operator()(&local_78,iVar9,iVar7);
            SetElement(&local_78,iVar6,iVar7,*pdVar4);
            SetElement(&local_78,iVar9,iVar7,local_68);
            pdVar4 = operator()(&local_40,iVar6,iVar7);
            local_68 = *pdVar4;
            pdVar4 = operator()(&local_40,iVar9,iVar7);
            SetElement(&local_40,iVar6,iVar7,*pdVar4);
            SetElement(&local_40,iVar9,iVar7,local_68);
            iVar7 = iVar7 + 1;
          } while (iVar7 < local_78.cols);
          iVar8 = local_78.rows;
        }
        iVar7 = iVar3;
        if (iVar3 < iVar8) {
          do {
            pdVar4 = operator()(&local_78,iVar7,iVar6);
            local_68 = *pdVar4;
            pdVar4 = operator()(&local_78,iVar6,iVar6);
            if (0 < local_78.cols) {
              local_68 = local_68 / *pdVar4;
              iVar8 = 0;
              do {
                pdVar4 = operator()(&local_78,iVar7,iVar8);
                local_58 = *pdVar4;
                pdVar4 = operator()(&local_78,iVar6,iVar8);
                SetElement(&local_78,iVar7,iVar8,local_58 - *pdVar4 * local_68);
                pdVar4 = operator()(&local_40,iVar7,iVar8);
                local_58 = *pdVar4;
                pdVar4 = operator()(&local_40,iVar6,iVar8);
                SetElement(&local_40,iVar7,iVar8,local_58 - *pdVar4 * local_68);
                iVar8 = iVar8 + 1;
              } while (iVar8 < local_78.cols);
            }
            iVar7 = iVar7 + 1;
            iVar8 = local_78.rows;
          } while (iVar7 < local_78.rows);
        }
        iVar7 = iVar8 + -1;
        iVar6 = iVar3;
      } while (iVar3 < iVar7);
    }
    if (0 < iVar8) {
      local_7c = 1;
      if (1 < iVar7) {
        local_7c = iVar7;
      }
      do {
        iVar6 = iVar8 + -1;
        pdVar4 = operator()(&local_78,iVar6,iVar6);
        dVar11 = *pdVar4;
        if (ABS(dVar11) <= 1e-15) {
          plVar10 = &std::cerr;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"this matrix is not invertible",0x1d);
          lVar5 = std::cerr;
LAB_0010fb79:
          std::ios::widen((char)*(undefined8 *)(lVar5 + -0x18) + (char)plVar10);
          std::ostream::put((char)plVar10);
          std::ostream::flush();
          *local_50 = 1;
          goto LAB_0010fba8;
        }
        uStack_60 = 0;
        local_68 = dVar11;
        local_44 = iVar7;
        if (0 < local_78.cols) {
          iVar7 = 0;
          do {
            pdVar4 = operator()(&local_78,iVar6,iVar7);
            SetElement(&local_78,iVar6,iVar7,*pdVar4 / local_68);
            pdVar4 = operator()(&local_40,iVar6,iVar7);
            SetElement(&local_40,iVar6,iVar7,*pdVar4 / local_68);
            iVar7 = iVar7 + 1;
          } while (iVar7 < local_78.cols);
        }
        if (iVar8 != 1) {
          iVar7 = 0;
          do {
            pdVar4 = operator()(&local_78,iVar7,iVar6);
            if (0 < local_78.cols) {
              local_68 = *pdVar4;
              iVar9 = 0;
              do {
                pdVar4 = operator()(&local_78,iVar7,iVar9);
                local_58 = *pdVar4;
                pdVar4 = operator()(&local_78,iVar6,iVar9);
                SetElement(&local_78,iVar7,iVar9,local_58 - *pdVar4 * local_68);
                pdVar4 = operator()(&local_40,iVar7,iVar9);
                local_58 = *pdVar4;
                pdVar4 = operator()(&local_40,iVar6,iVar9);
                SetElement(&local_40,iVar7,iVar9,local_58 - *pdVar4 * local_68);
                iVar9 = iVar9 + 1;
              } while (iVar9 < local_78.cols);
            }
            iVar7 = iVar7 + 1;
          } while (iVar7 != local_7c);
        }
        iVar7 = local_44 + -1;
        local_7c = 1;
        if (1 < iVar7) {
          local_7c = iVar7;
        }
        bVar1 = 1 < iVar8;
        iVar8 = iVar6;
      } while (bVar1);
    }
    *local_50 = 0;
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"only square matrix can call this function(inverse)",0x32);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x10);
    std::ostream::put(-0x10);
    std::ostream::flush();
    *flag = 1;
  }
LAB_0010fba8:
  if (local_78.data != (double *)0x0) {
    operator_delete__(local_78.data);
  }
  MVar2.data = local_40.data;
  MVar2.rows = local_40.rows;
  MVar2.cols = local_40.cols;
  return MVar2;
}

Assistant:

Matrix<Type, _0, _1> Matrix<Type, _0, _1>::inverse(int &flag)
{
    // 此单位阵为待求逆矩阵的增广矩阵
    Matrix<Type, _0, _1> Identity_;
    Matrix<Type, _0, _1> copy;
    copy = (*this);

    if(_0 == Dynamic || _1 == Dynamic)
        Identity_.resize(copy.row(), copy.col());
    Identity_.Identity();

    if(this->col() != this->row())
    {
        cerr << "only square matrix can call this function(inverse)" << endl;
        flag = 1;
        copy.deleteMatrix();
        return Identity_;
    }
    // cout << copy << endl << endl;

    // 将主元置于对角线上
    for (int i = 0; i < copy.row() - 1; ++i)
    {
        // 目前主元位置
        // i行i列
        int posi = i;
        // 初始化主元绝对值大小
        Type value = abs(copy.operator()(i, i));

        // 对第 i+1行开始寻找真正主元
        for(int j = i + 1; j < copy.row(); ++j)
        {
            Type temp = abs(copy.operator()(j, i));
            if(temp > value)
            {
                posi = j;
                value = temp;
            }
        }
        // 若主元为0  则矩阵不可逆
        if (abs(value) <= 1e-10)
        {
            cerr << "this matrix is not invertible" << endl << endl;
            flag = 1;
            copy.deleteMatrix();
            return Identity_;
        }
        // 如果主元不在第i行 则交换两行
        // 同时也要将增广矩阵（单位矩阵）交换相应的两行
        if(posi != i)
        {
            for(int j = 0; j < copy.col(); ++j)
            {
                // 先交换矩阵
                Type temp = copy.operator()(i, j);
                copy.SetElement(i, j, copy.operator()(posi, j));
                copy.SetElement(posi, j, temp);

                // 交换单位阵
                temp = Identity_(i, j);
                Identity_.SetElement(i, j, Identity_(posi, j));
                Identity_.SetElement(posi, j, temp);
            }
        }

        // 将下三角矩阵变为0 (应该可以减少一个循环)
        // 经过实践 并不能少循环
        for(int j = i + 1; j < copy.row(); ++j)
        {
            Type factor = copy.operator()(j, i) / copy.operator()(i, i);
            for(int k = 0; k < copy.col(); ++k)
            {
                Type temp = copy.operator()(j, k) - copy.operator()(i, k) * factor;
                copy.SetElement(j, k, temp);

                temp = Identity_(j, k) - Identity_(i, k) * factor;
                Identity_.SetElement(j, k, temp);
            }
        }
    }

    // 判断对角元素是否为0
    // 若为0则矩阵不可逆
    // 若不为0 则将对角置为1 
    // 且将上三角置为0
    for(int i = copy.row() - 1; i > -1; --i)
    {
        Type temp = copy.operator()(i, i);
        if(abs(temp) <= 1e-15)
        {
            cerr << "this matrix is not invertible" << endl;
            flag = 1;
            copy.deleteMatrix();
            return Identity_;
        }
        // 将对角置1
        for(int j = 0; j < copy.col(); ++j)
        {
            Type deno = copy.operator()(i, j) / temp;
            copy.SetElement(i, j, deno);

            deno = Identity_(i, j) / temp;
            Identity_.SetElement(i, j, deno);
        }
        // 同样的方法上三角置0
        for(int j = 0; j < i; ++j)
        {
            Type deno = copy.operator()(j, i);
            for(int k = 0; k < copy.col(); ++k)
            {
                Type temp = copy.operator()(j, k) - copy.operator()(i, k) * deno;
                copy.SetElement(j, k, temp);
                temp = Identity_(j, k) - Identity_(i, k) * deno;
                Identity_.SetElement(j, k, temp);
            }
        }
    }
    flag = 0;
    copy.deleteMatrix();
    return Identity_;
}